

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenReader.cpp
# Opt level: O3

int __thiscall ninx::parser::TokenReader::check_type(TokenReader *this,Type type)

{
  pointer puVar1;
  tuple<ninx::lexer::token::Token_*,_std::default_delete<ninx::lexer::token::Token>_> tVar2;
  uint uVar3;
  Type TVar4;
  
  puVar1 = (this->tokens->
           super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = 0xffffffff;
  if (((ulong)(long)this->current_token <
       (ulong)((long)(this->tokens->
                     super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) &&
     (tVar2.
      super__Tuple_impl<0UL,_ninx::lexer::token::Token_*,_std::default_delete<ninx::lexer::token::Token>_>
      .super__Head_base<0UL,_ninx::lexer::token::Token_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_ninx::lexer::token::Token_*,_std::default_delete<ninx::lexer::token::Token>_>
             *)&puVar1[this->current_token]._M_t.
                super___uniq_ptr_impl<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
     , tVar2.
       super__Tuple_impl<0UL,_ninx::lexer::token::Token_*,_std::default_delete<ninx::lexer::token::Token>_>
       .super__Head_base<0UL,_ninx::lexer::token::Token_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ninx::lexer::token::Token_*,_false>)0x0)) {
    TVar4 = (**(code **)(*(long *)tVar2.
                                  super__Tuple_impl<0UL,_ninx::lexer::token::Token_*,_std::default_delete<ninx::lexer::token::Token>_>
                                  .super__Head_base<0UL,_ninx::lexer::token::Token_*,_false>.
                                  _M_head_impl + 0x10))();
    uVar3 = (uint)(TVar4 == type);
  }
  return uVar3;
}

Assistant:

int ninx::parser::TokenReader::check_type(Type type) {
    auto token = peek_token();
    if (!token) {
        return -1;
    }

    return token->get_type() == type;
}